

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O0

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<0>::
DecodeInternal<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
          (DynamicIntegerPointsKdTreeDecoder<0> *this,uint32_t num_points,
          ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
          *oit)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  bool bVar4;
  int iVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  *in_RDX;
  uint32_t in_ESI;
  DynamicIntegerPointsKdTreeDecoder<0> *in_RDI;
  uint32_t second_half;
  uint32_t first_half;
  uint32_t number;
  int incoming_bits;
  uint32_t modifier;
  int num_remaining_bits;
  uint32_t num_remaining_bits_1;
  uint32_t j;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t level;
  uint32_t axis;
  VectorUint32 *levels;
  VectorUint32 *old_base;
  uint32_t stack_pos;
  uint32_t last_axis;
  uint32_t num_remaining_points;
  DecodingStatus status;
  stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
  status_stack;
  DecodingStatus init_status;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  DynamicIntegerPointsKdTreeDecoder<0> *in_stack_fffffffffffffda0;
  allocator_type *in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  undefined4 in_stack_fffffffffffffdb8;
  int iVar10;
  undefined4 in_stack_fffffffffffffdbc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdc0;
  VectorUint32 *in_stack_fffffffffffffdc8;
  Self *in_stack_fffffffffffffdd0;
  DirectBitDecoder *in_stack_fffffffffffffdd8;
  value_type local_1d0;
  DirectBitDecoder *in_stack_fffffffffffffe38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe40;
  DecodingStatus local_150;
  DecodingStatus local_144;
  uint32_t local_138;
  uint32_t local_134;
  uint local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  value_type local_10c;
  uint32_t local_108;
  undefined4 local_104;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_100;
  DirectBitDecoder *local_f8;
  uint local_ec;
  uint32_t local_e8;
  uint local_e4;
  undefined8 local_e0;
  uint local_d8;
  DecodingStatus local_7c;
  undefined4 local_6c;
  undefined4 local_3c;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  *local_20;
  uint32_t local_14;
  byte local_1;
  
  local_3c = 0;
  local_20 = in_RDX;
  local_14 = in_ESI;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x2996a9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffdc0,CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)
             ,(value_type_conflict5 *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffda8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator[](&in_RDI->base_stack_,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffda8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x29971a);
  local_6c = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x29974d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffdc0,CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)
             ,(value_type_conflict5 *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffda8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator[](&in_RDI->levels_stack_,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffda8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x2997c5);
  DecodingStatus::DecodingStatus(&local_7c,local_14,0,0);
  std::
  stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>>>
  ::
  stack<std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>>,void>
            ((stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
              *)in_stack_fffffffffffffda0);
  std::
  stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
  ::push((stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
          *)in_stack_fffffffffffffda0,
         (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  do {
    bVar4 = std::
            stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
            ::empty((stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
                     *)0x299825);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      local_1 = 1;
LAB_0029a18d:
      local_104 = 1;
      std::
      stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
      ::~stack((stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
                *)0x29a19a);
      return (bool)(local_1 & 1);
    }
    pvVar6 = std::
             stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
             ::top((stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
                    *)0x29984d);
    local_d8 = pvVar6->stack_pos;
    local_e0._0_4_ = pvVar6->num_remaining_points;
    local_e0._4_4_ = pvVar6->last_axis;
    std::
    stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
    ::pop((stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
           *)0x299881);
    local_e4 = (uint)local_e0;
    local_e8 = local_e0._4_4_;
    local_ec = local_d8;
    local_f8 = (DirectBitDecoder *)
               std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&in_RDI->base_stack_,(ulong)local_d8);
    local_100 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[](&in_RDI->levels_stack_,(ulong)local_ec);
    if (local_14 < local_e4) {
      local_1 = 0;
      goto LAB_0029a18d;
    }
    local_108 = GetAxis(in_RDI,local_e4,local_100,local_e8);
    if (in_RDI->dimension_ <= local_108) {
      local_1 = 0;
      goto LAB_0029a18d;
    }
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_100,(ulong)local_108);
    uVar1 = local_108;
    local_10c = *pvVar7;
    if (in_RDI->bit_length_ == local_10c) {
      for (local_110 = 0; local_110 < local_e4; local_110 = local_110 + 1) {
        in_stack_fffffffffffffe38 = local_f8;
        in_stack_fffffffffffffe40 =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
             ::operator*(local_20);
        ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
        ::operator=((ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
                     *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                    (SourceType *)in_stack_fffffffffffffda8);
        ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
        ::operator++((ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
                      *)in_stack_fffffffffffffda0);
        in_RDI->num_decoded_points_ = in_RDI->num_decoded_points_ + 1;
      }
    }
    else if (local_e4 < 3) {
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&in_RDI->axes_,0);
      *pvVar8 = uVar1;
      for (local_114 = 1; local_114 < in_RDI->dimension_; local_114 = local_114 + 1) {
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&in_RDI->axes_,(ulong)(local_114 - 1));
        if (*pvVar8 == in_RDI->dimension_ - 1) {
          local_1d0 = 0;
        }
        else {
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->axes_,(ulong)(local_114 - 1));
          local_1d0 = *pvVar8 + 1;
        }
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&in_RDI->axes_,(ulong)local_114);
        *pvVar8 = local_1d0;
      }
      for (local_118 = 0; local_118 < local_e4; local_118 = local_118 + 1) {
        for (local_11c = 0; local_11c < in_RDI->dimension_; local_11c = local_11c + 1) {
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->axes_,(ulong)local_11c);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->p_,(ulong)*pvVar8);
          this_00 = local_100;
          *pvVar8 = 0;
          uVar1 = in_RDI->bit_length_;
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->axes_,(ulong)local_11c);
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (this_00,(ulong)*pvVar8);
          local_120 = uVar1 - *pvVar7;
          if (local_120 != 0) {
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&in_RDI->axes_,(ulong)local_11c);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      (&in_RDI->p_,(ulong)*pvVar8);
            bVar4 = DirectBitDecoder::DecodeLeastSignificantBits32
                              (in_stack_fffffffffffffdd8,
                               (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                               (uint32_t *)in_stack_fffffffffffffdc8);
            if (!bVar4) {
              local_1 = 0;
              goto LAB_0029a18d;
            }
          }
          in_stack_fffffffffffffdd8 = local_f8;
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->axes_,(ulong)local_11c);
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_stack_fffffffffffffdd8->bits_,(ulong)*pvVar8);
          uVar2 = *pvVar7;
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->axes_,(ulong)local_11c);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->p_,(ulong)*pvVar8);
          uVar3 = *pvVar8;
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->axes_,(ulong)local_11c);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->p_,(ulong)*pvVar8);
          *pvVar8 = uVar2 | uVar3;
        }
        in_stack_fffffffffffffdc8 = &in_RDI->p_;
        in_stack_fffffffffffffdd0 =
             ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
             ::operator*(local_20);
        ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
        ::operator=((ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
                     *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                    (SourceType *)in_stack_fffffffffffffda8);
        ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
        ::operator++((ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
                      *)in_stack_fffffffffffffda0);
        in_RDI->num_decoded_points_ = in_RDI->num_decoded_points_ + 1;
      }
    }
    else {
      if (in_RDI->num_points_ < in_RDI->num_decoded_points_) {
        local_1 = 0;
        goto LAB_0029a18d;
      }
      local_124 = in_RDI->bit_length_ - local_10c;
      local_128 = 1 << ((char)local_124 - 1U & 0x1f);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[](&in_RDI->base_stack_,(ulong)(local_ec + 1));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (in_stack_fffffffffffffe40,&in_stack_fffffffffffffe38->bits_);
      iVar10 = local_128;
      pvVar9 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&in_RDI->base_stack_,(ulong)(local_ec + 1));
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar9,(ulong)local_108);
      *pvVar8 = *pvVar8 + iVar10;
      iVar5 = MostSignificantBit(local_e4);
      local_130 = 0;
      local_12c = iVar5;
      DecodeNumber(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,(uint32_t *)0x299fbf);
      local_134 = local_e4 >> 1;
      if (local_134 < local_130) {
        local_1 = 0;
        goto LAB_0029a18d;
      }
      local_134 = local_134 - local_130;
      local_138 = local_e4 - local_134;
      if ((local_134 != local_138) &&
         (in_stack_fffffffffffffdb7 =
               DirectBitDecoder::DecodeNextBit((DirectBitDecoder *)CONCAT44(iVar5,iVar10)),
         !(bool)in_stack_fffffffffffffdb7)) {
        std::swap<unsigned_int>(&local_134,&local_138);
      }
      in_stack_fffffffffffffda0 = (DynamicIntegerPointsKdTreeDecoder<0> *)&in_RDI->levels_stack_;
      pvVar9 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)in_stack_fffffffffffffda0,(ulong)local_ec);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar9,(ulong)local_108);
      *pvVar8 = *pvVar8 + 1;
      in_stack_fffffffffffffda8 =
           (allocator_type *)
           std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)in_stack_fffffffffffffda0,(ulong)local_ec);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)in_stack_fffffffffffffda0,(ulong)(local_ec + 1));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (in_stack_fffffffffffffe40,&in_stack_fffffffffffffe38->bits_);
      if (local_134 != 0) {
        DecodingStatus::DecodingStatus(&local_144,local_134,local_108,local_ec);
        std::
        stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
        ::push((stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
                *)in_stack_fffffffffffffda0,
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      }
      if (local_138 != 0) {
        DecodingStatus::DecodingStatus(&local_150,local_138,local_108,local_ec + 1);
        std::
        stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
        ::push((stack<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<0>::DecodingStatus>_>_>
                *)in_stack_fffffffffffffda0,
               (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      }
    }
  } while( true );
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodeInternal(
    uint32_t num_points, OutputIteratorT &oit) {
  typedef DecodingStatus Status;
  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  DecodingStatus init_status(num_points, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    const DecodingStatus status = status_stack.top();
    status_stack.pop();

    const uint32_t num_remaining_points = status.num_remaining_points;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    if (num_remaining_points > num_points) {
      return false;
    }

    const uint32_t axis = GetAxis(num_remaining_points, levels, last_axis);
    if (axis >= dimension_) {
      return false;
    }

    const uint32_t level = levels[axis];

    // All axes have been fully subdivided, just output points.
    if ((bit_length_ - level) == 0) {
      for (uint32_t i = 0; i < num_remaining_points; i++) {
        *oit = old_base;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    DRACO_DCHECK_EQ(true, num_remaining_points != 0);

    // Fast decoding of remaining bits if number of points is 1 or 2.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        for (uint32_t j = 0; j < dimension_; j++) {
          p_[axes_[j]] = 0;
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            if (!remaining_bits_decoder_.DecodeLeastSignificantBits32(
                    num_remaining_bits, &p_[axes_[j]])) {
              return false;
            }
          }
          p_[axes_[j]] = old_base[axes_[j]] | p_[axes_[j]];
        }
        *oit = p_;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    if (num_decoded_points_ > num_points_) {
      return false;
    }

    const int num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;         // copy
    base_stack_[stack_pos + 1][axis] += modifier;  // new base

    const int incoming_bits = MostSignificantBit(num_remaining_points);

    uint32_t number = 0;
    DecodeNumber(incoming_bits, &number);

    uint32_t first_half = num_remaining_points / 2;
    if (first_half < number) {
      // Invalid |number|.
      return false;
    }
    first_half -= number;
    uint32_t second_half = num_remaining_points - first_half;

    if (first_half != second_half) {
      if (!half_decoder_.DecodeNextBit()) {
        std::swap(first_half, second_half);
      }
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (first_half) {
      status_stack.push(DecodingStatus(first_half, axis, stack_pos));
    }
    if (second_half) {
      status_stack.push(DecodingStatus(second_half, axis, stack_pos + 1));
    }
  }
  return true;
}